

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::interface_variable_exists_in_entry_point(Compiler *this,uint32_t id)

{
  uint32_t uVar1;
  CompilerError *this_00;
  size_type sVar2;
  TypedID<(spirv_cross::Types)2> *pTVar3;
  TypedID<(spirv_cross::Types)2> *pTVar4;
  TypedID<(spirv_cross::Types)2> local_44;
  SPIREntryPoint *local_40;
  SPIREntryPoint *execution;
  SPIRVariable *local_28;
  SPIRVariable *var;
  Compiler *pCStack_18;
  uint32_t id_local;
  Compiler *this_local;
  
  var._4_4_ = id;
  pCStack_18 = this;
  local_28 = get<spirv_cross::SPIRVariable>(this,id);
  uVar1 = ParsedIR::get_spirv_version(&this->ir);
  if (uVar1 < 0x10400) {
    if (((local_28->storage != StorageClassInput) && (local_28->storage != StorageClassOutput)) &&
       (local_28->storage != StorageClassUniformConstant)) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "Only Input, Output variables and Uniform constants are part of a shader linking interface."
                );
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    sVar2 = ::std::
            unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>_>
            ::size(&(this->ir).entry_points);
    if (sVar2 < 2) {
      return true;
    }
  }
  local_40 = get_entry_point(this);
  pTVar3 = ::std::begin<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                     (&local_40->interface_variables);
  pTVar4 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                     (&local_40->interface_variables);
  TypedID<(spirv_cross::Types)2>::TypedID(&local_44,var._4_4_);
  pTVar3 = ::std::
           find<spirv_cross::TypedID<(spirv_cross::Types)2>const*,spirv_cross::TypedID<(spirv_cross::Types)2>>
                     (pTVar3,pTVar4,&local_44);
  pTVar4 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                     (&local_40->interface_variables);
  return pTVar3 != pTVar4;
}

Assistant:

bool Compiler::interface_variable_exists_in_entry_point(uint32_t id) const
{
	auto &var = get<SPIRVariable>(id);

	if (ir.get_spirv_version() < 0x10400)
	{
		if (var.storage != StorageClassInput && var.storage != StorageClassOutput &&
		    var.storage != StorageClassUniformConstant)
			SPIRV_CROSS_THROW("Only Input, Output variables and Uniform constants are part of a shader linking interface.");

		// This is to avoid potential problems with very old glslang versions which did
		// not emit input/output interfaces properly.
		// We can assume they only had a single entry point, and single entry point
		// shaders could easily be assumed to use every interface variable anyways.
		if (ir.entry_points.size() <= 1)
			return true;
	}

	// In SPIR-V 1.4 and later, all global resource variables must be present.

	auto &execution = get_entry_point();
	return find(begin(execution.interface_variables), end(execution.interface_variables), VariableID(id)) !=
	       end(execution.interface_variables);
}